

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O0

bool __thiscall Ptex::v2_4::StringKey::matches(StringKey *this,StringKey *key)

{
  long in_RSI;
  long *in_RDI;
  char *unaff_retaddr;
  char *in_stack_00000008;
  bool local_11;
  
  local_11 = false;
  if (((*(int *)(in_RSI + 0xc) == *(int *)((long)in_RDI + 0xc)) &&
      (local_11 = false, *(int *)(in_RSI + 8) == (int)in_RDI[1])) &&
     (local_11 = false, *in_RDI != 0)) {
    local_11 = memCompare(in_stack_00000008,unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
    local_11 = !local_11;
  }
  return local_11;
}

Assistant:

bool matches(const StringKey& key) volatile
    {
        return key._hash == _hash && key._len == _len && _val && 0 == memCompare(key._val, _val, _len);
    }